

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O2

MatrixXd * Tools::CalculateJacobian(MatrixXd *__return_storage_ptr__,VectorXd *x_state)

{
  double dVar1;
  double dVar2;
  CoeffReturnType pdVar3;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar4;
  ostream *poVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Scalar local_c0;
  float local_b8;
  float local_a8;
  double local_98;
  double local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_38;
  
  local_38.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)CONCAT44(local_38.m_xpr._4_4_,3);
  local_c0 = (Scalar)CONCAT44(local_c0._4_4_,4);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(int *)&local_38,
             (int *)&local_c0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,0);
  local_a8 = (float)*pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,1);
  local_b8 = (float)*pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,2);
  dVar1 = *pdVar3;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state,3);
  dVar2 = *pdVar3;
  local_38.m_xpr = __return_storage_ptr__;
  if ((0.001 <= ABS(local_a8)) || (0.001 <= ABS(local_b8))) {
    fVar7 = local_a8 * local_a8 + local_b8 * local_b8;
    fVar8 = SQRT(fVar7);
    local_90 = (double)(local_a8 / fVar8);
    local_38.m_row = 0;
    local_38.m_col = 1;
    local_38.m_currentBlockRows = 1;
    *(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
     m_storage.m_data = local_90;
    local_c0 = (Scalar)(local_b8 / fVar8);
    local_98 = local_c0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_38,&local_c0);
    local_40 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_40);
    local_48 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_48);
    local_50 = (Scalar)(-local_b8 / fVar7);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_50);
    local_58 = (Scalar)(local_a8 / fVar7);
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_58);
    local_60 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_60);
    local_68 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_68);
    fVar9 = (float)dVar2 * local_a8;
    fVar6 = (float)dVar1 * local_b8;
    local_70 = (Scalar)(((fVar6 - fVar9) * local_b8) / (fVar7 * fVar8));
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_70);
    local_78 = (Scalar)(((fVar9 - fVar6) * local_a8) / (fVar7 * fVar8));
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_78);
    local_80 = local_90;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_80);
    local_88 = local_98;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar4,&local_88);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_38)
    ;
  }
  else {
    local_38.m_row = 0;
    local_38.m_col = 1;
    local_38.m_currentBlockRows = 1;
    *(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
     m_storage.m_data = 0.0;
    local_c0 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_38,&local_c0);
    local_40 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_40);
    local_48 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_48);
    local_50 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_50);
    local_58 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_58);
    local_60 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_60);
    local_68 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_68);
    local_70 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_70);
    local_78 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_78);
    local_80 = 0.0;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar4,&local_80);
    local_88 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar4,&local_88);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_38)
    ;
    poVar5 = std::operator<<((ostream *)&std::cout,"Division by zero");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

MatrixXd Tools::CalculateJacobian(const VectorXd& x_state) {

    MatrixXd Hj(3,4);

    //recover state parameters
    float px = x_state(0);
    float py = x_state(1);
    float vx = x_state(2);
    float vy = x_state(3);
    
    //check division by zero
    if (fabs(px)<0.001 && fabs(py)<0.001) {
        Hj << 0, 0, 0, 0,
              0, 0, 0, 0,
              0, 0, 0, 0;
	std::cout << "Division by zero" << std::endl;
    } else {
        //compute the Jacobian matrix
        float dvdr2 = px*px + py*py;
        float dvdr1 = sqrt(dvdr2);
        float dvdr3 = dvdr1 * dvdr2;
        
        Hj << px/dvdr1,               py/dvdr1,               0,        0,
              -py/dvdr2,              px/dvdr2,               0,        0,
              py*(vx*py-vy*px)/dvdr3, px*(vy*px-vx*py)/dvdr3, px/dvdr1, py/dvdr1;
    }
    
    return Hj;


}